

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter_test.cpp
# Opt level: O0

void __thiscall
InterpreterTestSuite_IESV_SingleImportFileMustPass_Test::
~InterpreterTestSuite_IESV_SingleImportFileMustPass_Test
          (InterpreterTestSuite_IESV_SingleImportFileMustPass_Test *this)

{
  InterpreterTestSuite_IESV_SingleImportFileMustPass_Test *this_local;
  
  ~InterpreterTestSuite_IESV_SingleImportFileMustPass_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F(InterpreterTestSuite, IESV_SingleImportFileMustPass)
{
    TestContext ctx;
    InitContext(ctx);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.1", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net1", 1, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain1", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);
    ASSERT_EQ(
        ctx.mRegistry->Add(BorderAgent{"127.0.0.2", 20001, ByteArray{}, "1.1", BorderAgent::State{0, 0, 0, 0, 0},
                                       "net2", 2, "", "", Timestamp{0, 0, 0}, 0, "", ByteArray{}, "domain2", 0, 0, "",
                                       0, 0x1F | BorderAgent::kDomainNameBit | BorderAgent::kExtendedPanIdBit}),
        RegistryStatus::kSuccess);

    CommissionerAppMockPtr commissionerAppMock{new CommissionerAppMock()};
    EXPECT_CALL(ctx.mCommissionerAppStaticExpecter, Create(_, _))
        .WillOnce(
            DoAll(WithArg<0>([&](std::shared_ptr<CommissionerApp> &a) { a = commissionerAppMock; }), Return(Error{})));
    EXPECT_CALL(*commissionerAppMock, Start(_, _, _)).WillOnce(Return(Error{}));

    // Create CommissionerAppMock for the network
    Interpreter::Expression expr;
    expr = ctx.mInterpreter.ParseExpression("start --nwk net1");
    EXPECT_TRUE(ctx.mInterpreter.Eval(expr).HasNoError());
    ctx.mInterpreter.mContext.Cleanup();
    ctx.mInterpreter.mJobManager->CleanupJobs();

    BorderRouter br;
    br.mNetworkId = 0;
    ASSERT_EQ(ctx.mRegistry->SetCurrentNetwork(br), RegistryStatus::kSuccess);

    // Attention: changed Channel->Number and SecurityPolicy->Flags
    std::string jsonStr = "{\n\
    \"ActiveTimestamp\": {\n\
        \"Seconds\": 56, // 48 bits\n\
        \"Ticks\": 44, // 15 bits\n\
        \"U\": 1 // 1 bit\n\
    },\n\
    \"Channel\": {\n\
        \"Number\": 19,\n\
        \"Page\": 0\n\
    },\n\
    \"ChannelMask\": [\n\
        {\n\
            \"Length\": 4,\n\
            \"Masks\": \"001fffe0\", // ByteArray in hex string.\n\
            \"Page\": 0\n\
        }\n\
    ],\n\
    \"ExtendedPanId\": \"dead00beef00cafe\",\n\
    \"NetworkName\": \"test-active\",\n\
    \"PSKc\": \"3aa55f91ca47d1e4e71a08cb35e91591\", // ByteArray in hex string.\n\
    \"PanId\": \"0xface\", // 0xface\n\
    \"SecurityPolicy\": {\n\
        \"Flags\": \"f8\", // 0xf8\n\
        \"RotationTime\": 672\n\
    }\n\
}";

    EXPECT_EQ(WriteFile(jsonStr, "./tmp/json.json").GetCode(), ErrorCode::kNone);

    EXPECT_CALL(*commissionerAppMock, SetActiveDataset(_)).WillOnce(Return(Error{}));
    expr       = ctx.mInterpreter.ParseExpression("opdataset set active --import ./tmp/json.json");
    auto value = ctx.mInterpreter.Eval(expr);
    EXPECT_TRUE(value.HasNoError());
}